

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsPostsolveStatus __thiscall Highs::runPostsolve(Highs *this)

{
  HighsSolution *solution;
  bool bVar1;
  HighsPostsolveStatus HVar2;
  
  HVar2 = kNoPrimalSolutionError;
  if ((this->presolve_).data_.recovered_solution_.value_valid == true) {
    solution = &(this->presolve_).data_.recovered_solution_;
    bVar1 = (this->presolve_).data_.recovered_solution_.dual_valid;
    ::presolve::HighsPostsolveStack::undo
              (&(this->presolve_).data_.postSolveStack,&this->options_,solution,
               &(this->presolve_).data_.recovered_basis_,-1);
    calculateRowValuesQuad(&(this->model_).lp_,solution,-1);
    if ((bVar1 == true) && ((this->model_).lp_.sense_ == kMaximize)) {
      PresolveComponent::negateReducedLpColDuals(&this->presolve_);
    }
    (this->presolve_).postsolve_status_ = kSolutionRecovered;
    HVar2 = kSolutionRecovered;
  }
  return HVar2;
}

Assistant:

HighsPostsolveStatus Highs::runPostsolve() {
  // assert(presolve_.has_run_);
  const bool have_primal_solution =
      presolve_.data_.recovered_solution_.value_valid;
  // Need at least a primal solution
  if (!have_primal_solution)
    return HighsPostsolveStatus::kNoPrimalSolutionError;
  const bool have_dual_solution =
      presolve_.data_.recovered_solution_.dual_valid;
  presolve_.data_.postSolveStack.undo(options_,
                                      presolve_.data_.recovered_solution_,
                                      presolve_.data_.recovered_basis_);
  // Compute the row activities
  assert(model_.lp_.a_matrix_.isColwise());
  calculateRowValuesQuad(model_.lp_, presolve_.data_.recovered_solution_);

  if (have_dual_solution && model_.lp_.sense_ == ObjSense::kMaximize)
    presolve_.negateReducedLpColDuals();

  // Ensure that the postsolve status is used to set
  // presolve_.postsolve_status_, as well as being returned
  HighsPostsolveStatus postsolve_status =
      HighsPostsolveStatus::kSolutionRecovered;
  presolve_.postsolve_status_ = postsolve_status;
  return postsolve_status;
}